

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O0

size_t __thiscall
jsoncons::detail::write_double::operator()
          (write_double *this,double val,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *result)

{
  char cVar1;
  bool bVar2;
  undefined8 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> *__a;
  json_runtime_error<std::invalid_argument,_void> *this_01;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  int length;
  char number_buffer [200];
  size_t count;
  string *in_stack_fffffffffffffd68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd70;
  undefined8 in_stack_fffffffffffffd78;
  char decimal_point;
  double in_stack_fffffffffffffd80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd88;
  undefined8 in_stack_fffffffffffffd90;
  char decimal_point_00;
  size_t in_stack_fffffffffffffd98;
  allocator<char> *in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffda8;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe18;
  char in_stack_fffffffffffffe27;
  double in_stack_fffffffffffffe28;
  char local_199 [39];
  undefined1 local_172;
  undefined1 local_14a;
  undefined1 local_125;
  int local_ec;
  char local_e8 [200];
  size_t local_20;
  
  decimal_point_00 = (char)((ulong)in_stack_fffffffffffffd90 >> 0x38);
  local_20 = 0;
  local_ec = 0;
  cVar1 = *(char *)(in_RDI + 0x20);
  decimal_point = (char)((ulong)in_stack_fffffffffffffd78 >> 0x38);
  if (cVar1 == '\0') {
    if (*(int *)(in_RDI + 0x24) < 1) {
      bVar2 = dtoa_general<std::__cxx11::string>
                        (in_stack_fffffffffffffd80,decimal_point,in_stack_fffffffffffffd70);
      if (!bVar2) {
        uVar3 = __cxa_allocate_exception(0x18);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
        json_runtime_error<std::invalid_argument,_void>::json_runtime_error
                  ((json_runtime_error<std::invalid_argument,_void> *)in_stack_fffffffffffffd70,
                   in_stack_fffffffffffffd68);
        __cxa_throw(uVar3,&json_runtime_error<std::invalid_argument,void>::typeinfo,
                    json_runtime_error<std::invalid_argument,_void>::~json_runtime_error);
      }
    }
    else {
      local_ec = snprintf(local_e8,200,"%1.*g",in_XMM0_Qa,(ulong)*(uint *)(in_RDI + 0x24));
      if (local_ec < 0) {
        uVar3 = __cxa_allocate_exception(0x18);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
        json_runtime_error<std::invalid_argument,_void>::json_runtime_error
                  ((json_runtime_error<std::invalid_argument,_void> *)in_stack_fffffffffffffd70,
                   in_stack_fffffffffffffd68);
        __cxa_throw(uVar3,&json_runtime_error<std::invalid_argument,void>::typeinfo,
                    json_runtime_error<std::invalid_argument,_void>::~json_runtime_error);
      }
      dump_buffer<std::__cxx11::string>
                ((char *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,decimal_point_00,
                 in_stack_fffffffffffffd88);
    }
  }
  else if (cVar1 == '\x01') {
    if (*(int *)(in_RDI + 0x24) < 1) {
      bVar2 = dtoa_fixed<std::__cxx11::string>
                        (in_stack_fffffffffffffd80,decimal_point,in_stack_fffffffffffffd70);
      if (!bVar2) {
        local_14a = 1;
        uVar3 = __cxa_allocate_exception(0x18);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
        json_runtime_error<std::invalid_argument,_void>::json_runtime_error
                  ((json_runtime_error<std::invalid_argument,_void> *)in_stack_fffffffffffffd70,
                   in_stack_fffffffffffffd68);
        local_14a = 0;
        __cxa_throw(uVar3,&json_runtime_error<std::invalid_argument,void>::typeinfo,
                    json_runtime_error<std::invalid_argument,_void>::~json_runtime_error);
      }
    }
    else {
      local_ec = snprintf(local_e8,200,"%1.*f",in_XMM0_Qa,(ulong)*(uint *)(in_RDI + 0x24));
      if (local_ec < 0) {
        local_125 = 1;
        uVar3 = __cxa_allocate_exception(0x18);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
        json_runtime_error<std::invalid_argument,_void>::json_runtime_error
                  ((json_runtime_error<std::invalid_argument,_void> *)in_stack_fffffffffffffd70,
                   in_stack_fffffffffffffd68);
        local_125 = 0;
        __cxa_throw(uVar3,&json_runtime_error<std::invalid_argument,void>::typeinfo,
                    json_runtime_error<std::invalid_argument,_void>::~json_runtime_error);
      }
      dump_buffer<std::__cxx11::string>
                ((char *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,decimal_point_00,
                 in_stack_fffffffffffffd88);
    }
  }
  else {
    if (cVar1 != '\x02') {
      this_01 = (json_runtime_error<std::invalid_argument,_void> *)__cxa_allocate_exception(0x18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
      json_runtime_error<std::invalid_argument,_void>::json_runtime_error
                (this_01,in_stack_fffffffffffffd68);
      __cxa_throw(this_01,&json_runtime_error<std::invalid_argument,void>::typeinfo,
                  json_runtime_error<std::invalid_argument,_void>::~json_runtime_error);
    }
    if (*(int *)(in_RDI + 0x24) < 1) {
      bVar2 = dtoa_scientific<std::__cxx11::string>
                        (in_stack_fffffffffffffe28,in_stack_fffffffffffffe27,
                         in_stack_fffffffffffffe18);
      if (!bVar2) {
        __a = (allocator<char> *)__cxa_allocate_exception(0x18);
        __s = local_199;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(in_stack_fffffffffffffdb0,__s,__a);
        json_runtime_error<std::invalid_argument,_void>::json_runtime_error
                  ((json_runtime_error<std::invalid_argument,_void> *)in_stack_fffffffffffffd70,
                   in_stack_fffffffffffffd68);
        __cxa_throw(__a,&json_runtime_error<std::invalid_argument,void>::typeinfo,
                    json_runtime_error<std::invalid_argument,_void>::~json_runtime_error);
      }
    }
    else {
      local_ec = snprintf(local_e8,200,"%1.*e",in_XMM0_Qa,(ulong)*(uint *)(in_RDI + 0x24));
      if (local_ec < 0) {
        local_172 = 1;
        this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __cxa_allocate_exception(0x18);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this_00,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
        json_runtime_error<std::invalid_argument,_void>::json_runtime_error
                  ((json_runtime_error<std::invalid_argument,_void> *)in_stack_fffffffffffffd70,
                   in_stack_fffffffffffffd68);
        local_172 = 0;
        __cxa_throw(this_00,&json_runtime_error<std::invalid_argument,void>::typeinfo,
                    json_runtime_error<std::invalid_argument,_void>::~json_runtime_error);
      }
      dump_buffer<std::__cxx11::string>
                ((char *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,decimal_point_00,
                 in_stack_fffffffffffffd88);
    }
  }
  return local_20;
}

Assistant:

std::size_t operator()(double val, Result& result)
        {
            std::size_t count = 0;

            char number_buffer[200];
            int length = 0;

            switch (float_format_)
            {
            case float_chars_format::fixed:
                {
                    if (precision_ > 0)
                    {
                        length = snprintf(number_buffer, sizeof(number_buffer), "%1.*f", precision_, val);
                        if (length < 0)
                        {
                            JSONCONS_THROW(json_runtime_error<std::invalid_argument>("write_double failed."));
                        }
                        dump_buffer(number_buffer, length, decimal_point_, result);
                    }
                    else
                    {
                        if (!dtoa_fixed(val, decimal_point_, result))
                        {
                            JSONCONS_THROW(json_runtime_error<std::invalid_argument>("write_double failed."));
                        }
                    }
                }
                break;
            case float_chars_format::scientific:
                {
                    if (precision_ > 0)
                    {
                        length = snprintf(number_buffer, sizeof(number_buffer), "%1.*e", precision_, val);
                        if (length < 0)
                        {
                            JSONCONS_THROW(json_runtime_error<std::invalid_argument>("write_double failed."));
                        }
                        dump_buffer(number_buffer, length, decimal_point_, result);
                    }
                    else
                    {
                        if (!dtoa_scientific(val, decimal_point_, result))
                        {
                            JSONCONS_THROW(json_runtime_error<std::invalid_argument>("write_double failed."));
                        }
                    }
                }
                break;
            case float_chars_format::general:
                {
                    if (precision_ > 0)
                    {
                        length = snprintf(number_buffer, sizeof(number_buffer), "%1.*g", precision_, val);
                        if (length < 0)
                        {
                            JSONCONS_THROW(json_runtime_error<std::invalid_argument>("write_double failed."));
                        }
                        dump_buffer(number_buffer, length, decimal_point_, result);
                    }
                    else
                    {
                        if (!dtoa_general(val, decimal_point_, result))
                        {
                            JSONCONS_THROW(json_runtime_error<std::invalid_argument>("write_double failed."));
                        }
                    }             
                    break;
                }
                default:
                    JSONCONS_THROW(json_runtime_error<std::invalid_argument>("write_double failed."));
                    break;
            }
            return count;
        }